

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::SimplifyLocals<false,_false,_true>::create(SimplifyLocals<false,_false,_true> *this)

{
  _func_int **local_20;
  
  std::make_unique<wasm::SimplifyLocals<false,false,true>>();
  (this->
  super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
  ).super_Pass._vptr_Pass = local_20;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<
      SimplifyLocals<allowTee, allowStructure, allowNesting>>();
  }